

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O1

bool __thiscall
glslang::TParseVersions::checkExtensionsRequested
          (TParseVersions *this,TSourceLoc *loc,int numExtensions,char **extensions,
          char *featureDesc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar1;
  EShMessages EVar2;
  TInfoSink *this_00;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  pool_allocator<char> local_d8;
  TPoolAllocator *local_d0;
  size_type *local_c8;
  size_type local_c0;
  size_type local_b8;
  undefined8 uStack_b0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  uVar7 = (ulong)(uint)numExtensions;
  bVar8 = 0 < numExtensions;
  if (0 < numExtensions) {
    iVar4 = (*this->_vptr_TParseVersions[7])(this,*extensions);
    if (iVar4 - 3U < 0xfffffffe) {
      uVar6 = 0;
      do {
        if (uVar7 - 1 == uVar6) goto LAB_00361935;
        iVar4 = (*this->_vptr_TParseVersions[7])(this,extensions[uVar6 + 1]);
        uVar6 = uVar6 + 1;
      } while (iVar4 - 3U < 0xfffffffe);
      bVar8 = uVar6 < uVar7;
    }
    if (bVar8) {
      return true;
    }
  }
LAB_00361935:
  if (numExtensions < 1) {
    bVar8 = false;
  }
  else {
    uVar6 = 0;
    bVar8 = false;
    do {
      iVar4 = (*this->_vptr_TParseVersions[7])(this,extensions[uVar6]);
      if (iVar4 == 4) {
        EVar2 = this->messages;
        iVar4 = 4;
        if ((EVar2 & EShMsgRelaxedErrors) != EShMsgDefault) {
          TInfoSinkBase::message
                    (&this->infoSink->info,EPrefixWarning,
                     "The following extension must be enabled to use this feature:",loc,
                     (bool)((byte)(EVar2 >> 0x10) & 1),(bool)((byte)(EVar2 >> 0x11) & 1));
          iVar4 = 3;
        }
      }
      if (iVar4 == 3) {
        this_00 = this->infoSink;
        __s = extensions[uVar6];
        local_d8.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_58,__s,&local_d8);
        pbVar5 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::replace
                           (&local_58,0,0,"extension ",10);
        local_a8._M_dataplus.super_allocator_type.allocator =
             (pbVar5->_M_dataplus).super_allocator_type.allocator;
        local_a8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar1 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
             *)local_a8._M_dataplus._M_p == paVar1) {
          local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        }
        else {
          local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        }
        local_a8._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                           (&local_a8," is being used for ");
        local_80._M_dataplus.super_allocator_type.allocator =
             (pbVar5->_M_dataplus).super_allocator_type.allocator;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar1 = &pbVar5->field_2;
        if (paVar3 == paVar1) {
          local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_80._M_dataplus._M_p = (pointer)paVar3;
        }
        local_80._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                           (&local_80,featureDesc);
        local_d0 = (pbVar5->_M_dataplus).super_allocator_type.allocator;
        local_c8 = (size_type *)(pbVar5->_M_dataplus)._M_p;
        paVar1 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
             *)local_c8 == paVar1) {
          local_b8 = paVar1->_M_allocated_capacity;
          uStack_b0 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_c8 = &local_b8;
        }
        else {
          local_b8 = paVar1->_M_allocated_capacity;
        }
        local_c0 = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        TInfoSinkBase::message
                  (&this_00->info,EPrefixWarning,(char *)local_c8,loc,
                   (bool)((byte)(this->messages >> 0x10) & 1),
                   (bool)((byte)(this->messages >> 0x11) & 1));
        bVar8 = true;
      }
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  return bVar8;
}

Assistant:

bool TParseVersions::checkExtensionsRequested(const TSourceLoc& loc, int numExtensions, const char* const extensions[], const char* featureDesc)
{
    // First, see if any of the extensions are enabled
    for (int i = 0; i < numExtensions; ++i) {
        TExtensionBehavior behavior = getExtensionBehavior(extensions[i]);
        if (behavior == EBhEnable || behavior == EBhRequire)
            return true;
    }

    // See if any extensions want to give a warning on use; give warnings for all such extensions
    bool warned = false;
    for (int i = 0; i < numExtensions; ++i) {
        TExtensionBehavior behavior = getExtensionBehavior(extensions[i]);
        if (behavior == EBhDisable && relaxedErrors()) {
            infoSink.info.message(EPrefixWarning, "The following extension must be enabled to use this feature:", loc,
                                  messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
            behavior = EBhWarn;
        }
        if (behavior == EBhWarn) {
            infoSink.info.message(EPrefixWarning,
                                  ("extension " + TString(extensions[i]) + " is being used for " + featureDesc).c_str(),
                                  loc, messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
            warned = true;
        }
    }
    if (warned)
        return true;
    return false;
}